

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

uint * If_DsdObjHashLookup(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint uVar1;
  int iVar2;
  If_DsdObj_t *pObj;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = nLits * 0x1fd3 + Type * 0x1ec1;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < nLits) {
    uVar4 = (ulong)(uint)nLits;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    uVar1 = uVar1 + *(int *)(If_DsdObjHashKey_s_Primes + (ulong)((uint)uVar5 & 0xf) * 4) *
                    pLits[uVar5];
  }
  if (Type == 6) {
    uVar1 = uVar1 + *(int *)(If_DsdObjHashKey_s_Primes + (ulong)((uint)uVar4 & 0xf) * 4) * truthId;
  }
  puVar3 = p->pBins + (ulong)uVar1 % (ulong)(uint)p->nBins;
  while( true ) {
    if (*puVar3 == 0) {
      p->nUniqueMisses = p->nUniqueMisses + 1;
      return puVar3;
    }
    pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,*puVar3);
    if (((*(uint *)&pObj->field_0x4 >> 0x1b == nLits && (*(uint *)&pObj->field_0x4 & 7) == Type) &&
        (iVar2 = bcmp(pObj + 1,pLits,(ulong)(uint)(nLits * 4)), iVar2 == 0)) &&
       (iVar2 = If_DsdObjTruthId(p,pObj), iVar2 == truthId)) break;
    puVar3 = (uint *)Vec_IntEntryP(&p->vNexts,pObj->Id);
  }
  p->nUniqueHits = p->nUniqueHits + 1;
  return puVar3;
}

Assistant:

unsigned * If_DsdObjHashLookup( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj;
    unsigned * pSpot = p->pBins + If_DsdObjHashKey(p, Type, pLits, nLits, truthId);
    for ( ; *pSpot; pSpot = (unsigned *)Vec_IntEntryP(&p->vNexts, pObj->Id) )
    {
        pObj = If_DsdVecObj( &p->vObjs, *pSpot );
        if ( If_DsdObjType(pObj) == Type && 
             If_DsdObjFaninNum(pObj) == nLits && 
             !memcmp(pObj->pFans, pLits, sizeof(int)*If_DsdObjFaninNum(pObj)) &&
             truthId == If_DsdObjTruthId(p, pObj) )
        {
            p->nUniqueHits++;
            return pSpot;
        }
    }
    p->nUniqueMisses++;
    return pSpot;
}